

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O2

Gia_Man_t * Eso_ManCoverConvert(Eso_Man_t *p,Vec_Ptr_t *vCover)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iLit0;
  Gia_Man_t *p_00;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  Gia_Obj_t *pObj;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar8;
  int iVar9;
  int i;
  int iRoot;
  
  p_00 = Gia_ManStart(p->pGia->nObjs);
  pcVar5 = Abc_UtilStrsav(p->pGia->pName);
  p_00->pName = pcVar5;
  pcVar5 = Abc_UtilStrsav(p->pGia->pSpec);
  p_00->pSpec = pcVar5;
  Gia_ManHashAlloc(p_00);
  pGVar8 = p->pGia;
  pGVar8->pObjs->Value = 0;
  iVar9 = 0;
  while ((iVar9 < pGVar8->vCis->nSize &&
         (pGVar6 = Gia_ManCi(pGVar8,iVar9), pGVar6 != (Gia_Obj_t *)0x0))) {
    pObj = Gia_ManAppendObj(p_00);
    uVar1 = *(ulong *)pObj;
    *(ulong *)pObj = uVar1 | 0x9fffffff;
    *(ulong *)pObj =
         uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
    pVVar7 = p_00->vCis;
    iVar2 = Gia_ObjId(p_00,pObj);
    Vec_IntPush(pVVar7,iVar2);
    iVar2 = Gia_ObjId(p_00,pObj);
    pGVar6->Value = iVar2 * 2;
    iVar9 = iVar9 + 1;
    pGVar8 = p->pGia;
  }
  for (iVar9 = 0; iVar9 < vCover->nSize; iVar9 = iVar9 + 1) {
    pVVar7 = (Vec_Int_t *)Vec_PtrEntry(vCover,iVar9);
    iVar2 = pVVar7->nSize;
    if (iVar2 < 1) {
      iLit0 = 0;
    }
    else {
      iLit0 = 0;
      for (i = 0; i < iVar2; i = i + 1) {
        iVar3 = Vec_IntEntry(pVVar7,i);
        iVar2 = 1;
        if (iVar3 != p->Cube1) {
          p_01 = Eso_ManCube(p,iVar3);
          iVar2 = 1;
          for (iVar3 = 0; iVar3 < p_01->nSize; iVar3 = iVar3 + 1) {
            iVar4 = Vec_IntEntry(p_01,iVar3);
            iVar2 = Gia_ManHashAnd(p_00,iVar2,iVar4 + 2);
          }
        }
        iLit0 = Gia_ManHashXor(p_00,iLit0,iVar2);
        iVar2 = pVVar7->nSize;
      }
    }
    Gia_ManAppendCo(p_00,iLit0);
  }
  pGVar8 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar8;
}

Assistant:

Gia_Man_t * Eso_ManCoverConvert( Eso_Man_t * p, Vec_Ptr_t * vCover )
{
    Vec_Int_t * vEsop;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;  int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p->pGia) );
    pNew->pName = Abc_UtilStrsav( p->pGia->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pGia->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p->pGia)->Value = 0;
    Gia_ManForEachCi( p->pGia, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Vec_PtrForEachEntry( Vec_Int_t *, vCover, vEsop, i )
    {
        if ( Vec_IntSize(vEsop) > 0 )
        {
            int c, Cube, iRoot = 0;
            Vec_IntForEachEntry( vEsop, Cube, c )
            {
                int k, Lit, iAnd = 1;
                if ( Cube != p->Cube1 )
                {
                    Vec_Int_t * vCube = Eso_ManCube( p, Cube );
                    Vec_IntForEachEntry( vCube, Lit, k )
                        iAnd = Gia_ManHashAnd( pNew, iAnd, Lit + 2 );
                }
                iRoot = Gia_ManHashXor( pNew, iRoot, iAnd );
            }
            Gia_ManAppendCo( pNew, iRoot );
        }
        else
            Gia_ManAppendCo( pNew, 0 );
    }
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}